

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O2

bool CreateDirectory<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dirname)

{
  int iVar1;
  char *local_30 [4];
  
  std::__cxx11::string::string((string *)local_30,(string *)dirname);
  iVar1 = mkdir(local_30[0],0x1ed);
  std::__cxx11::string::~string((string *)local_30);
  return iVar1 == 0;
}

Assistant:

bool CreateDirectory(const std::basic_string<T>& dirname)
{
#ifdef _WIN32
    if (!CreateDirectory(ToTString(dirname).c_str(), NULL))
        return false;
#endif
#ifdef _UNIX
    if (mkdir(ToString(dirname).c_str(), 0755))
        return false;
#endif
    return true;
}